

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

uint8_t * __thiscall
icu_63::BMPSet::spanUTF8(BMPSet *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  byte *pbVar1;
  byte bVar2;
  UBool UVar3;
  USetSpanCondition UVar4;
  uint c_00;
  byte bVar5;
  char local_59;
  UChar32 c_1;
  UChar32 c;
  uint32_t twoBits;
  uint8_t t3;
  uint8_t t2;
  uint8_t t1;
  uint8_t *limit0;
  byte *pbStack_30;
  uint8_t b;
  uint8_t *limit;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  uint8_t *s_local;
  BMPSet *this_local;
  
  _twoBits = s + length;
  limit0._7_1_ = *s;
  limit._4_4_ = length;
  _spanCondition_local = s;
  if ((limit0._7_1_ & 0x80) == 0) {
    if (spanCondition == USET_SPAN_NOT_CONTAINED) {
      do {
        if ((this->latin1Contains[limit0._7_1_] != '\0') ||
           (_spanCondition_local = _spanCondition_local + 1, _spanCondition_local == _twoBits)) {
          return _spanCondition_local;
        }
        limit0._7_1_ = *_spanCondition_local;
      } while ((limit0._7_1_ & 0x80) == 0);
    }
    else {
      do {
        if ((this->latin1Contains[limit0._7_1_] == '\0') ||
           (_spanCondition_local = _spanCondition_local + 1, _spanCondition_local == _twoBits)) {
          return _spanCondition_local;
        }
        limit0._7_1_ = *_spanCondition_local;
      } while ((limit0._7_1_ & 0x80) == 0);
    }
    limit._4_4_ = (int)_twoBits - (int)_spanCondition_local;
  }
  limit._0_4_ = spanCondition;
  if (spanCondition != USET_SPAN_NOT_CONTAINED) {
    limit._0_4_ = USET_SPAN_CONTAINED;
  }
  limit0._7_1_ = _twoBits[-1];
  pbVar1 = _spanCondition_local;
  pbStack_30 = _twoBits;
  if ((char)limit0._7_1_ < '\0') {
    if (limit0._7_1_ < 0xc0) {
      if ((limit._4_4_ < 2) || (limit0._7_1_ = _twoBits[-2], limit0._7_1_ < 0xe0)) {
        if ((limit0._7_1_ < 0xc0) &&
           ((((0x7f < limit0._7_1_ && (2 < limit._4_4_)) && (0xef < _twoBits[-3])) &&
            (pbStack_30 = _twoBits + -3, (int)this->containsFFFD != (USetSpanCondition)limit)))) {
          _twoBits = pbStack_30;
        }
      }
      else {
        pbStack_30 = _twoBits + -2;
        if ((int)this->containsFFFD != (USetSpanCondition)limit) {
          _twoBits = pbStack_30;
        }
      }
    }
    else {
      pbStack_30 = _twoBits + -1;
      if ((int)this->containsFFFD != (USetSpanCondition)limit) {
        _twoBits = pbStack_30;
      }
    }
  }
LAB_003ff6ad:
  do {
    _spanCondition_local = pbVar1;
    if (pbStack_30 <= _spanCondition_local) {
      return _twoBits;
    }
    limit0._7_1_ = *_spanCondition_local;
    if ((limit0._7_1_ & 0x80) == 0) {
      if ((USetSpanCondition)limit == USET_SPAN_NOT_CONTAINED) {
        do {
          if (this->latin1Contains[limit0._7_1_] != '\0') {
            return _spanCondition_local;
          }
          _spanCondition_local = _spanCondition_local + 1;
          if (_spanCondition_local == pbStack_30) {
            return _twoBits;
          }
          limit0._7_1_ = *_spanCondition_local;
        } while ((limit0._7_1_ & 0x80) == 0);
      }
      else {
        do {
          if (this->latin1Contains[limit0._7_1_] == '\0') {
            return _spanCondition_local;
          }
          _spanCondition_local = _spanCondition_local + 1;
          if (_spanCondition_local == pbStack_30) {
            return _twoBits;
          }
          limit0._7_1_ = *_spanCondition_local;
        } while ((limit0._7_1_ & 0x80) == 0);
      }
    }
    pbVar1 = _spanCondition_local + 1;
    if (limit0._7_1_ < 0xe0) {
      if ((0xbf < limit0._7_1_) && ((byte)(*pbVar1 + 0x80) < 0x40)) {
        if (((this->table7FF[(byte)(*pbVar1 + 0x80)] & 1 << (limit0._7_1_ & 0x1f)) != 0) !=
            (USetSpanCondition)limit) {
          return _spanCondition_local;
        }
        pbVar1 = _spanCondition_local + 2;
        goto LAB_003ff6ad;
      }
    }
    else if (limit0._7_1_ < 0xf0) {
      bVar2 = *pbVar1 + 0x80;
      if ((bVar2 < 0x40) && ((byte)(_spanCondition_local[2] + 0x80) < 0x40)) {
        bVar5 = limit0._7_1_ & 0xf;
        UVar4 = this->bmpBlockBits[bVar2] >> bVar5 & 0x10001;
        if (UVar4 < USET_SPAN_SIMPLE) {
          if (UVar4 != (USetSpanCondition)limit) {
            return _spanCondition_local;
          }
        }
        else {
          UVar3 = containsSlow(this,(uint)bVar5 << 0xc | (uint)bVar2 << 6 |
                                    (uint)(byte)(_spanCondition_local[2] + 0x80),
                               this->list4kStarts[bVar5],this->list4kStarts[(int)(bVar5 + 1)]);
          if ((int)UVar3 != (USetSpanCondition)limit) {
            return _spanCondition_local;
          }
        }
        pbVar1 = _spanCondition_local + 3;
        goto LAB_003ff6ad;
      }
    }
    else if ((((byte)(*pbVar1 + 0x80) < 0x40) && ((byte)(_spanCondition_local[2] + 0x80) < 0x40)) &&
            ((byte)(_spanCondition_local[3] + 0x80) < 0x40)) {
      c_00 = (limit0._7_1_ - 0xf0) * 0x40000 | (uint)(byte)(*pbVar1 + 0x80) << 0xc |
             (uint)(byte)(_spanCondition_local[2] + 0x80) << 6 |
             (uint)(byte)(_spanCondition_local[3] + 0x80);
      if (((int)c_00 < 0x10000) || (0x10ffff < (int)c_00)) {
        local_59 = this->containsFFFD;
      }
      else {
        local_59 = containsSlow(this,c_00,this->list4kStarts[0x10],this->list4kStarts[0x11]);
      }
      if ((int)local_59 != (USetSpanCondition)limit) {
        return _spanCondition_local;
      }
      pbVar1 = _spanCondition_local + 4;
      goto LAB_003ff6ad;
    }
    if ((int)this->containsFFFD != (USetSpanCondition)limit) {
      return _spanCondition_local;
    }
  } while( true );
}

Assistant:

const uint8_t *
BMPSet::spanUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    const uint8_t *limit=s+length;
    uint8_t b=*s;
    if(U8_IS_SINGLE(b)) {
        // Initial all-ASCII span.
        if(spanCondition) {
            do {
                if(!latin1Contains[b] || ++s==limit) {
                    return s;
                }
                b=*s;
            } while(U8_IS_SINGLE(b));
        } else {
            do {
                if(latin1Contains[b] || ++s==limit) {
                    return s;
                }
                b=*s;
            } while(U8_IS_SINGLE(b));
        }
        length=(int32_t)(limit-s);
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    const uint8_t *limit0=limit;

    /*
     * Make sure that the last 1/2/3/4-byte sequence before limit is complete
     * or runs into a lead byte.
     * In the span loop compare s with limit only once
     * per multi-byte character.
     *
     * Give a trailing illegal sequence the same value as the result of contains(FFFD),
     * including it if that is part of the span, otherwise set limit0 to before
     * the truncated sequence.
     */
    b=*(limit-1);
    if((int8_t)b<0) {
        // b>=0x80: lead or trail byte
        if(b<0xc0) {
            // single trail byte, check for preceding 3- or 4-byte lead byte
            if(length>=2 && (b=*(limit-2))>=0xe0) {
                limit-=2;
                if(containsFFFD!=spanCondition) {
                    limit0=limit;
                }
            } else if(b<0xc0 && b>=0x80 && length>=3 && (b=*(limit-3))>=0xf0) {
                // 4-byte lead byte with only two trail bytes
                limit-=3;
                if(containsFFFD!=spanCondition) {
                    limit0=limit;
                }
            }
        } else {
            // lead byte with no trail bytes
            --limit;
            if(containsFFFD!=spanCondition) {
                limit0=limit;
            }
        }
    }

    uint8_t t1, t2, t3;

    while(s<limit) {
        b=*s;
        if(U8_IS_SINGLE(b)) {
            // ASCII
            if(spanCondition) {
                do {
                    if(!latin1Contains[b]) {
                        return s;
                    } else if(++s==limit) {
                        return limit0;
                    }
                    b=*s;
                } while(U8_IS_SINGLE(b));
            } else {
                do {
                    if(latin1Contains[b]) {
                        return s;
                    } else if(++s==limit) {
                        return limit0;
                    }
                    b=*s;
                } while(U8_IS_SINGLE(b));
            }
        }
        ++s;  // Advance past the lead byte.
        if(b>=0xe0) {
            if(b<0xf0) {
                if( /* handle U+0000..U+FFFF inline */
                    (t1=(uint8_t)(s[0]-0x80)) <= 0x3f &&
                    (t2=(uint8_t)(s[1]-0x80)) <= 0x3f
                ) {
                    b&=0xf;
                    uint32_t twoBits=(bmpBlockBits[t1]>>b)&0x10001;
                    if(twoBits<=1) {
                        // All 64 code points with this lead byte and middle trail byte
                        // are either in the set or not.
                        if(twoBits!=(uint32_t)spanCondition) {
                            return s-1;
                        }
                    } else {
                        // Look up the code point in its 4k block of code points.
                        UChar32 c=(b<<12)|(t1<<6)|t2;
                        if(containsSlow(c, list4kStarts[b], list4kStarts[b+1]) != spanCondition) {
                            return s-1;
                        }
                    }
                    s+=2;
                    continue;
                }
            } else if( /* handle U+10000..U+10FFFF inline */
                (t1=(uint8_t)(s[0]-0x80)) <= 0x3f &&
                (t2=(uint8_t)(s[1]-0x80)) <= 0x3f &&
                (t3=(uint8_t)(s[2]-0x80)) <= 0x3f
            ) {
                // Give an illegal sequence the same value as the result of contains(FFFD).
                UChar32 c=((UChar32)(b-0xf0)<<18)|((UChar32)t1<<12)|(t2<<6)|t3;
                if( (   (0x10000<=c && c<=0x10ffff) ?
                            containsSlow(c, list4kStarts[0x10], list4kStarts[0x11]) :
                            containsFFFD
                    ) != spanCondition
                ) {
                    return s-1;
                }
                s+=3;
                continue;
            }
        } else {
            if( /* handle U+0000..U+07FF inline */
                b>=0xc0 &&
                (t1=(uint8_t)(*s-0x80)) <= 0x3f
            ) {
                if((USetSpanCondition)((table7FF[t1]&((uint32_t)1<<(b&0x1f)))!=0) != spanCondition) {
                    return s-1;
                }
                ++s;
                continue;
            }
        }

        // Give an illegal sequence the same value as the result of contains(FFFD).
        // Handle each byte of an illegal sequence separately to simplify the code;
        // no need to optimize error handling.
        if(containsFFFD!=spanCondition) {
            return s-1;
        }
    }

    return limit0;
}